

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O2

void build_adjacent_table
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
               int **_AdjB,int *AdjP)

{
  pointer ppVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  pair<int,_int> *e;
  pointer ppVar9;
  iterator __begin1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> edges_alter;
  pair<int,_int> local_38;
  
  edges_alter.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edges_alter.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  edges_alter.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar1 = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (ppVar9 = (edges->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar1; ppVar9 = ppVar9 + 1) {
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              (&edges_alter,ppVar9);
    local_38.second = ppVar9->first;
    local_38.first = ppVar9->second;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&edges_alter,
               &local_38);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<int(*)(std::pair<int,int>const&,std::pair<int,int>const&)>>
            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )edges_alter.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )edges_alter.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<int_(*)(const_std::pair<int,_int>_&,_const_std::pair<int,_int>_&)>)
             0x1182f0);
  ppVar1 = edges_alter.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppVar9 = edges_alter.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = ((long)edges_alter.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)edges_alter.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start) * 0x20000000;
  uVar8 = 0xffffffffffffffff;
  if (-1 < lVar2) {
    uVar8 = lVar2 >> 0x1e;
  }
  piVar3 = (int *)operator_new__(uVar8);
  lVar2 = -1;
  lVar4 = 0;
  while( true ) {
    iVar5 = (int)lVar2;
    if (ppVar9 == ppVar1) break;
    iVar6 = ppVar9->first;
    if (iVar6 != iVar5) {
      for (lVar2 = (long)iVar5; lVar2 < iVar6; lVar2 = lVar2 + 1) {
        AdjP[lVar2 + 1] = (int)lVar4;
        iVar6 = ppVar9->first;
      }
    }
    piVar3[lVar4] = ppVar9->second;
    lVar4 = lVar4 + 1;
    ppVar9 = ppVar9 + 1;
  }
  lVar7 = (long)size;
  for (lVar2 = (long)iVar5; lVar2 < lVar7; lVar2 = lVar2 + 1) {
    AdjP[lVar2 + 1] = (int)lVar4;
  }
  *_AdjB = piVar3;
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&edges_alter.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  return;
}

Assistant:

void build_adjacent_table(const vector<pair<int, int> > &edges, int **_AdjB, int *AdjP) {
    vector<pair<int, int> > edges_alter;
    for (auto &e : edges) {
        edges_alter.push_back(e);
        edges_alter.push_back(make_pair(e.second, e.first));
    }
    sort(edges_alter.begin(), edges_alter.end(), cmp_edges);
    int size_edge = edges_alter.size();
    int *AdjB = new int[size_edge];
    int curP = 0, curV = -1;
    for (auto &e: edges_alter) {
        if (e.first != curV) {
            //curV = e.first;
            for (curV += 1; curV <= e.first; ++curV)
                AdjP[curV] = curP;
            --curV;
        }
        AdjB[curP++] = e.second;
    }
    for (curV += 1; curV <= size; ++curV)
        AdjP[curV] = curP;
    
    *_AdjB = AdjB;
}